

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1518_numBottles.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int total;
  int iVar5;
  uint uVar6;
  
  iVar2 = 0xf;
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar5 = iVar5 + iVar2;
    uVar3 = iVar2 + iVar4;
    uVar6 = iVar2 + 3 + iVar4;
    uVar1 = uVar3;
    if ((int)uVar3 < 0) {
      uVar1 = uVar6;
    }
    iVar2 = (int)uVar1 >> 2;
    iVar4 = uVar3 - (uVar1 & 0xfffffffc);
  } while (6 < uVar6);
  std::ostream::operator<<((ostream *)&std::cout,iVar5);
  return 0;
}

Assistant:

int main()
{
	cout<<numWaterBottles(15,4);
	return 0;
}